

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cxx
# Opt level: O3

void __thiscall
cmsys::CommandLineArguments::PopulateVariable
          (CommandLineArguments *this,int *variable,string *value)

{
  long lVar1;
  char *res;
  char *local_10;
  
  local_10 = (char *)0x0;
  lVar1 = strtol((value->_M_dataplus)._M_p,&local_10,10);
  *variable = (int)lVar1;
  return;
}

Assistant:

void CommandLineArguments::PopulateVariable(
  int* variable, const std::string& value)
{
  char* res = 0;
  *variable = static_cast<int>(strtol(value.c_str(), &res, 10));
  //if ( res && *res )
  //  {
  //  Can handle non-int
  //  }
}